

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfig
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent indent)

{
  bool bVar1;
  bool bVar2;
  string dest;
  string literal_args;
  string toDir;
  Files files;
  string local_168;
  string local_148;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_f8;
  _Manager_type local_e8;
  code *local_e0;
  string local_c8;
  Files local_a8;
  
  GetFiles(&local_a8,this,config);
  if (local_a8.From.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.From.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GetDestination(&local_148,this,config);
    if (local_a8.ToDir._M_string_length != 0) {
      local_f8._M_unused._M_object = (void *)local_148._M_string_length;
      local_f8._8_8_ = local_148._M_dataplus._M_p;
      local_128._8_8_ = &local_118;
      local_128._M_unused._0_8_ = (undefined8)&DAT_00000001;
      local_118 = (code *)CONCAT71(local_118._1_7_,0x2f);
      cmStrCat<std::__cxx11::string>
                (&local_c8,(cmAlphaNum *)&local_f8,(cmAlphaNum *)&local_128,&local_a8.ToDir);
      std::__cxx11::string::operator=((string *)&local_148,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_168,&local_148);
    local_f8._M_unused._M_object = (void *)local_168._M_string_length;
    local_f8._8_8_ = local_168._M_dataplus._M_p;
    local_128._8_8_ = &local_118;
    local_128._M_unused._0_8_ = (undefined8)&DAT_00000001;
    local_118 = (code *)CONCAT71(local_118._1_7_,0x2f);
    cmStrCat<>(&local_c8,(cmAlphaNum *)&local_f8,(cmAlphaNum *)&local_128);
    std::__cxx11::string::~string((string *)&local_168);
    if (local_a8.NoTweak == false) {
      local_f8._8_8_ = 0;
      local_e0 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:86:14)>
                 ::_M_invoke;
      local_e8 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:86:14)>
                 ::_M_manager;
      local_f8._M_unused._M_object = this;
      cmInstallGenerator::AddTweak(os,indent,config,&local_c8,&local_a8.To,(TweakMethod *)&local_f8)
      ;
      std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    }
    bVar1 = this->ImportLibrary;
    bVar2 = this->Optional;
    local_f8._M_unused._M_object = &local_e8;
    local_f8._8_8_ = (pointer)0x0;
    local_e8 = (_Manager_type)((ulong)local_e8 & 0xffffffffffffff00);
    if (local_a8.FromDir._M_string_length != 0) {
      std::operator+(&local_168," FILES_FROM_DIR \"",&local_a8.FromDir);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,&local_168,"\"");
      std::__cxx11::string::append((string *)local_f8._M_pod_data);
      std::__cxx11::string::~string((string *)local_128._M_pod_data);
      std::__cxx11::string::~string((string *)&local_168);
    }
    if (local_a8.UseSourcePermissions == true) {
      std::__cxx11::string::append(local_f8._M_pod_data);
    }
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,&local_148,local_a8.Type,&local_a8.From,
               (bool)((bVar1 | bVar2) & 1),(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
               (char *)0x0,(char *)local_f8._M_unused._0_8_,indent,(char *)0x0);
    if (local_a8.NoTweak == false) {
      local_128._8_8_ = (code **)0x0;
      local_110 = std::
                  _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:110:14)>
                  ::_M_invoke;
      local_118 = std::
                  _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx:110:14)>
                  ::_M_manager;
      local_128._M_unused._M_object = this;
      cmInstallGenerator::AddTweak
                (os,indent,config,&local_c8,&local_a8.To,(TweakMethod *)&local_128);
      std::_Function_base::~_Function_base((_Function_base *)&local_128);
    }
    std::__cxx11::string::~string((string *)local_f8._M_pod_data);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_148);
  }
  Files::~Files(&local_a8);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  // Compute the list of files to install for this target.
  Files files = this->GetFiles(config);

  // Skip this rule if no files are to be installed for the target.
  if (files.From.empty()) {
    return;
  }

  // Compute the effective install destination.
  std::string dest = this->GetDestination(config);
  if (!files.ToDir.empty()) {
    dest = cmStrCat(dest, '/', files.ToDir);
  }

  // Tweak files located in the destination directory.
  std::string toDir = cmStrCat(ConvertToAbsoluteDestination(dest), '/');

  // Add pre-installation tweaks.
  if (!files.NoTweak) {
    AddTweak(os, indent, config, toDir, files.To,
             [this](std::ostream& o, Indent i, const std::string& c,
                    const std::string& f) {
               this->PreReplacementTweaks(o, i, c, f);
             });
  }

  // Write code to install the target file.
  const char* no_dir_permissions = nullptr;
  const char* no_rename = nullptr;
  bool optional = this->Optional || this->ImportLibrary;
  std::string literal_args;
  if (!files.FromDir.empty()) {
    literal_args += " FILES_FROM_DIR \"" + files.FromDir + "\"";
  }
  if (files.UseSourcePermissions) {
    literal_args += " USE_SOURCE_PERMISSIONS";
  }
  this->AddInstallRule(os, dest, files.Type, files.From, optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       no_rename, literal_args.c_str(), indent);

  // Add post-installation tweaks.
  if (!files.NoTweak) {
    AddTweak(os, indent, config, toDir, files.To,
             [this](std::ostream& o, Indent i, const std::string& c,
                    const std::string& f) {
               this->PostReplacementTweaks(o, i, c, f);
             });
  }
}